

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketParser.cpp
# Opt level: O0

void __thiscall
PacketParser::subValues(PacketParser *this,int key,string *value,__ItemValueType value_type)

{
  ItemInfo *pIVar1;
  UnsupportedOperationException *pUVar2;
  allocator local_c9;
  string local_c8 [35];
  undefined1 local_a5;
  allocator local_91;
  string local_90 [32];
  _ItemValueInfo local_70;
  float local_4c;
  undefined1 local_48 [4];
  float result_1;
  anon_union_8_7_741defe4_for___ItemValueInfo_3 local_30;
  int local_28;
  __ItemValueType local_24;
  int result;
  __ItemValueType value_type_local;
  string *value_local;
  PacketParser *pPStack_10;
  int key_local;
  PacketParser *this_local;
  
  local_24 = value_type;
  _result = value;
  value_local._4_4_ = key;
  pPStack_10 = this;
  if (value_type == IVT_INT) {
    pIVar1 = AList::operator[](&this->data,key);
    pIVar1 = ItemInfo::operator[](pIVar1,"value");
    ItemInfo::get_value((_ItemValueInfo *)local_48,pIVar1);
    local_28 = std::__cxx11::stoi(_result,(size_t *)0x0,10);
    local_28 = local_30.iValue - local_28;
    pIVar1 = AList::operator[](&this->data,value_local._4_4_);
    pIVar1 = ItemInfo::operator[](pIVar1,"value");
    ItemInfo::operator=(pIVar1,&local_28);
  }
  else {
    if (value_type != IVT_FLOAT) {
      if (value_type == IVT_STRING) {
        local_a5 = 1;
        pUVar2 = (UnsupportedOperationException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_90,"Subtraction of strings is unsupported!",&local_91);
        UnsupportedOperationException::UnsupportedOperationException
                  (pUVar2,(string *)local_90,value_local._4_1_,local_24);
        local_a5 = 0;
        __cxa_throw(pUVar2,&UnsupportedOperationException::typeinfo,
                    UnsupportedOperationException::~UnsupportedOperationException);
      }
      pUVar2 = (UnsupportedOperationException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"Unsupported substraction on unknown type.",&local_c9);
      UnsupportedOperationException::UnsupportedOperationException
                (pUVar2,(string *)local_c8,value_local._4_1_,local_24);
      __cxa_throw(pUVar2,&UnsupportedOperationException::typeinfo,
                  UnsupportedOperationException::~UnsupportedOperationException);
    }
    pIVar1 = AList::operator[](&this->data,key);
    pIVar1 = ItemInfo::operator[](pIVar1,"value");
    ItemInfo::get_value(&local_70,pIVar1);
    local_4c = std::__cxx11::stof(_result,(size_t *)0x0);
    local_4c = local_70.field_3.fValue - local_4c;
    pIVar1 = AList::operator[](&this->data,value_local._4_4_);
    pIVar1 = ItemInfo::operator[](pIVar1,"value");
    ItemInfo::operator=(pIVar1,&local_4c);
  }
  return;
}

Assistant:

void	PacketParser::subValues(const int key, const std::string &value, const __ItemValueType value_type)
{
	if (value_type == IVT_INT)
	{
		int result = data[key]["value"].get_value().iValue - std::stoi(value);
		data[key]["value"] = result;
	}
	else if (value_type == IVT_FLOAT)
	{
		float result = data[key]["value"].get_value().fValue - std::stof(value);
		data[key]["value"] = result;
	}
	else if (value_type == IVT_STRING)
		throw UnsupportedOperationException("Subtraction of strings is unsupported!", key, value_type);
	else
		throw UnsupportedOperationException("Unsupported substraction on unknown type.", key, value_type);
}